

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O3

http_request * parse_request(http_request *__return_storage_ptr__,sub_string *text)

{
  _Rb_tree_header *p_Var1;
  http_request_line local_30;
  
  sub_string::sub_string(&(__return_storage_ptr__->request_line).uri);
  p_Var1 = &(__return_storage_ptr__->headers)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->headers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parse_request_line(&local_30,text);
  *(ulong *)((long)&(__return_storage_ptr__->request_line).uri.begin_ + 4) =
       CONCAT44(local_30.uri.end_._0_4_,local_30.uri.begin_._4_4_);
  *(undefined8 *)((long)&(__return_storage_ptr__->request_line).uri.end_ + 4) = local_30._20_8_;
  (__return_storage_ptr__->request_line).method = local_30.method;
  *(undefined4 *)&(__return_storage_ptr__->request_line).field_0x4 = local_30._4_4_;
  (__return_storage_ptr__->request_line).uri.begin_ =
       (char *)CONCAT44(local_30.uri.begin_._4_4_,local_30.uri.begin_._0_4_);
  parse_headers(text,&__return_storage_ptr__->headers);
  return __return_storage_ptr__;
}

Assistant:

http_request parse_request(sub_string& text)
{
    http_request result;

    result.request_line = parse_request_line(text);
    parse_headers(text, result.headers);

    return result;
}